

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall phosg::Image::reverse_horizontal(Image *this)

{
  long lVar1;
  long lVar2;
  long x;
  long y;
  uint64_t a1;
  uint64_t r1;
  uint64_t a2;
  uint64_t b2;
  uint64_t g2;
  uint64_t r2;
  uint64_t b1;
  uint64_t g1;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar2 = this->height;
  if (0 < lVar2) {
    lVar1 = this->width;
    y = 0;
    do {
      if (1 < lVar1) {
        lVar2 = -1;
        x = 0;
        do {
          read_pixel(this,x,y,&local_68,&local_38,&local_40,&local_70);
          read_pixel(this,this->width + lVar2,y,&local_48,&local_50,&local_58,&local_60);
          write_pixel(this,this->width + lVar2,y,local_68,local_38,local_40,local_70);
          write_pixel(this,x,y,local_48,local_50,local_58,local_60);
          x = x + 1;
          lVar1 = this->width;
          lVar2 = lVar2 + -1;
        } while (x < lVar1 / 2);
        lVar2 = this->height;
      }
      y = y + 1;
    } while (y < lVar2);
  }
  return;
}

Assistant:

void Image::reverse_horizontal() {
  for (ssize_t y = 0; y < this->height; y++) {
    for (ssize_t x = 0; x < this->width / 2; x++) {
      uint64_t r1, g1, b1, a1, r2, g2, b2, a2;
      this->read_pixel(x, y, &r1, &g1, &b1, &a1);
      this->read_pixel(this->width - x - 1, y, &r2, &g2, &b2, &a2);
      this->write_pixel(this->width - x - 1, y, r1, g1, b1, a1);
      this->write_pixel(x, y, r2, g2, b2, a2);
    }
  }
}